

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O1

CConnman * EnsureConnman(NodeContext *node)

{
  CConnman *pCVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (node->connman)._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t
           .super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
           super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  if (pCVar1 == (CConnman *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Error: Peer-to-peer functionality missing or disabled","");
    JSONRPCError(__return_storage_ptr__,-0x1f,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

CConnman& EnsureConnman(const NodeContext& node)
{
    if (!node.connman) {
        throw JSONRPCError(RPC_CLIENT_P2P_DISABLED, "Error: Peer-to-peer functionality missing or disabled");
    }
    return *node.connman;
}